

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,Context *context,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances)

{
  BufferBlock *this_00;
  BufferVar local_68;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,(TestContext *)context,(RenderContext *)name,description,
             SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,BUFFERMODE_PER_BLOCK);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00b2d018;
  this_00 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  bb::BufferVar::BufferVar(&local_68,"var",type,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (&this_00->m_variables,&local_68);
  glu::VarType::~VarType(&local_68.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
    operator_delete(local_68.m_name._M_dataplus._M_p,
                    local_68.m_name.field_2._M_allocated_capacity + 1);
  }
  this_00->m_flags = layoutFlags;
  if (0 < numInstances) {
    bb::BufferBlock::setArraySize(this_00,numInstances);
    std::__cxx11::string::_M_replace
              ((ulong)&this_00->m_instanceName,0,(char *)(this_00->m_instanceName)._M_string_length,
               0x950fc6);
  }
  return;
}

Assistant:

BlockBasicTypeCase (Context& context, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances)
		: SSBOLayoutCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, BUFFERMODE_PER_BLOCK)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", type, ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}
	}